

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

void sptk::snack::get_cand(Cross *cross,float *peak,int *loc,int nlags,int *ncand,float cand_thresh)

{
  float fVar1;
  short sVar2;
  float *pfVar3;
  int ncan;
  int start;
  float clip;
  float *s;
  float *r;
  float q;
  float p;
  float o;
  int *t;
  int lastl;
  int i;
  float cand_thresh_local;
  int *ncand_local;
  int nlags_local;
  int *loc_local;
  float *peak_local;
  Cross *cross_local;
  
  fVar1 = cross->maxval;
  sVar2 = cross->firstlag;
  pfVar3 = cross->correl;
  o = *pfVar3;
  q = pfVar3[1];
  p = pfVar3[2];
  ncan = 0;
  s = peak;
  r = pfVar3 + 3;
  t = loc;
  for (i = 1; i < nlags + -2; i = i + 1) {
    if (((cand_thresh * fVar1 < q) && (p <= q)) && (o <= q)) {
      *s = q;
      *t = i + sVar2;
      ncan = ncan + 1;
      s = s + 1;
      t = t + 1;
    }
    o = q;
    q = p;
    p = *r;
    r = r + 1;
  }
  *ncand = ncan;
  return;
}

Assistant:

static void get_cand(Cross *cross, float *peak, int *loc, int nlags, int *ncand,
                     float cand_thresh)
#endif
{
  register int i, lastl, *t;
  register float o, p, q, *r, *s, clip;
#if 0
  int start, ncan, maxl;
#else
  int start, ncan;
#endif

  clip = (float) (cand_thresh * cross->maxval);
#if 0
  maxl = cross->maxloc;
#endif
  lastl = nlags - 2;
  start = cross->firstlag;

  r = cross->correl;
  o= *r++;			/* first point */
  q = *r++;	                /* middle point */
  p = *r++;
  s = peak;
  t = loc;
  ncan=0;
  for(i=1; i < lastl; i++, o=q, q=p, p= *r++){
    if((q > clip) &&		/* is this a high enough value? */
      (q >= p) && (q >= o)){ /* NOTE: this finds SHOLDERS and PLATEAUS
				      as well as peaks (is this a good idea?) */
	*s++ = q;		/* record the peak value */
	*t++ = i + start;	/* and its location */
	ncan++;			/* count number of peaks found */
      }
  }
/*
  o = q;
  q = p;
  if( (q > clip) && (q >=0)){
    *s++ = q;
    *t++ = i+start;
    ncan++;
  }
*/
  *ncand = ncan;
}